

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

iterator * __thiscall
google::
dense_hashtable<std::pair<unsigned_long_const,int>,unsigned_long,std::hash<unsigned_long>,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SelectKey,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SetKey,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>
::insert_at<unsigned_long_const&,int>
          (iterator *__return_storage_ptr__,
          dense_hashtable<std::pair<unsigned_long_const,int>,unsigned_long,std::hash<unsigned_long>,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SelectKey,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SetKey,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>
          *this,size_type pos,unsigned_long *args,int *args_1)

{
  long lVar1;
  long lVar2;
  length_error *this_00;
  long lVar3;
  
  lVar1 = *(long *)(this + 0x30);
  if ((ulong)(*(long *)(this + 0x38) - lVar1) < 0xfffffffffffffff) {
    lVar2 = *(long *)(this + 0x50);
    if ((lVar1 == 0) || (*(long *)(this + 0x20) != *(long *)(lVar2 + pos * 0x10))) {
      *(long *)(this + 0x38) = *(long *)(this + 0x38) + 1;
    }
    else {
      *(long *)(this + 0x30) = lVar1 + -1;
    }
    lVar3 = pos * 0x10;
    *(unsigned_long *)(lVar2 + lVar3) = *args;
    *(int *)(lVar2 + 8 + lVar3) = *args_1;
    lVar1 = *(long *)(this + 0x40);
    __return_storage_ptr__->ht =
         (dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
          *)this;
    __return_storage_ptr__->pos = (pointer)(lVar2 + lVar3);
    __return_storage_ptr__->end = (pointer)(lVar1 * 0x10 + lVar2);
    return __return_storage_ptr__;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"insert overflow");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

size_type size() const { return num_elements - num_deleted; }